

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O3

string * __thiscall
soul::ASTUtilities::getTypeArraySignature_abi_cxx11_
          (string *__return_storage_ptr__,ASTUtilities *this,TypeArray *types)

{
  ulong __val;
  undefined8 uVar1;
  Structure *pSVar2;
  bool bVar3;
  char cVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  string *__str;
  char cVar8;
  long lVar9;
  char *pcVar10;
  Type t;
  long *local_90;
  long local_80;
  long lStack_78;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  undefined8 local_48;
  undefined8 local_40;
  StructurePtr local_38;
  
  __val = *(ulong *)(this + 8);
  cVar8 = '\x01';
  if (9 < __val) {
    uVar6 = __val;
    cVar4 = '\x04';
    do {
      cVar8 = cVar4;
      if (uVar6 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_001fa066;
      }
      if (uVar6 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_001fa066;
      }
      if (uVar6 < 10000) goto LAB_001fa066;
      bVar3 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar4 = cVar8 + '\x04';
    } while (bVar3);
    cVar8 = cVar8 + '\x01';
  }
LAB_001fa066:
  local_50 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,__val);
  if (*(long *)(this + 8) != 0) {
    pcVar10 = *(char **)this;
    lVar9 = *(long *)(this + 8) * 0x18;
    do {
      local_90 = &local_80;
      if (*pcVar10 == '\x06') {
        Type::getStruct((Type *)&local_48);
        pSVar2 = local_48;
        choc::text::createHexString<unsigned_long>(&local_70,(unsigned_long)local_48,0);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x25966c);
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar5[3];
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar5;
        }
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(pSVar2);
      }
      else {
        uVar1 = *(undefined8 *)pcVar10;
        local_40 = *(undefined8 *)(pcVar10 + 8);
        pSVar2 = *(Structure **)(pcVar10 + 0x10);
        if (pSVar2 != (Structure *)0x0) {
          (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
        }
        local_48._4_4_ = (Primitive)((ulong)uVar1 >> 0x20);
        local_48._0_4_ = (uint)(ushort)uVar1;
        local_38.object = pSVar2;
        Type::getShortIdentifierDescription_abi_cxx11_(&local_70,(Type *)&local_48);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x25966c);
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar5[3];
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar5;
        }
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(pSVar2);
      }
      pcVar10 = pcVar10 + 0x18;
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getTypeArraySignature (const AST::TypeArray& types)
    {
        auto result = std::to_string (types.size());

        for (auto& t : types)
        {
            if (t.isStruct())
                result += "_" + getSignatureString (t.getStruct().get());
            else
                result += "_" + t.withConstAndRefFlags (false, false).getShortIdentifierDescription();
        }

        return result;
    }